

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O3

void PARMCI_Memctl(armci_meminfo_t *meminfo)

{
  int rank;
  int local_c;
  
  comex_group_rank(0,&local_c);
  if (meminfo == (armci_meminfo_t *)0x0) {
    comex_error("PARMCI_Memget: Invalid arg #2 (NULL ptr)",0);
  }
  if (meminfo->cpid == local_c) {
    comex_free_local(meminfo->addr);
  }
  meminfo->armci_addr = (char *)0x0;
  meminfo->addr = (char *)0x0;
  return;
}

Assistant:

void PARMCI_Memctl(armci_meminfo_t *meminfo)
{
    int rank;

    comex_group_rank(COMEX_GROUP_WORLD, &rank);

    if(meminfo==NULL) comex_error("PARMCI_Memget: Invalid arg #2 (NULL ptr)",0);

    /* only the creator can delete the segment */
    if(meminfo->cpid == rank)
    {
        void *ptr = meminfo->addr;
        comex_free_local(ptr);
    }

    meminfo->addr       = NULL;
    meminfo->armci_addr = NULL;
    /* if(meminfo->attr!=NULL) free(meminfo->attr); */
}